

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<char>::swap(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t EltDiff_1;
  size_t EltDiff;
  size_type i;
  size_t NumShared;
  SmallVectorImpl<char> *RHS_local;
  SmallVectorImpl<char> *this_local;
  
  if (this != RHS) {
    bVar4 = SmallVectorTemplateCommon<char,_void>::isSmall
                      ((SmallVectorTemplateCommon<char,_void> *)this);
    if ((bVar4) ||
       (bVar4 = SmallVectorTemplateCommon<char,_void>::isSmall
                          ((SmallVectorTemplateCommon<char,_void> *)RHS), bVar4)) {
      sVar5 = SmallVectorBase::size((SmallVectorBase *)RHS);
      sVar6 = SmallVectorBase::capacity((SmallVectorBase *)this);
      if (sVar6 < sVar5) {
        sVar5 = SmallVectorBase::size((SmallVectorBase *)RHS);
        SmallVectorTemplateBase<char,_true>::grow
                  (&this->super_SmallVectorTemplateBase<char,_true>,sVar5);
      }
      sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
      sVar6 = SmallVectorBase::capacity((SmallVectorBase *)RHS);
      if (sVar6 < sVar5) {
        sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
        SmallVectorTemplateBase<char,_true>::grow
                  (&RHS->super_SmallVectorTemplateBase<char,_true>,sVar5);
      }
      i = SmallVectorBase::size((SmallVectorBase *)this);
      sVar5 = SmallVectorBase::size((SmallVectorBase *)RHS);
      if (sVar5 < i) {
        i = SmallVectorBase::size((SmallVectorBase *)RHS);
      }
      for (EltDiff = 0; EltDiff != i; EltDiff = EltDiff + 1) {
        sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
        if (sVar5 <= EltDiff) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                       );
        }
        pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        sVar5 = SmallVectorBase::size((SmallVectorBase *)RHS);
        if (sVar5 <= EltDiff) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                       );
        }
        std::swap<char>((char *)((long)pvVar1 + EltDiff),
                        (char *)((long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                       super_SmallVectorTemplateCommon<char,_void>.
                                       super_SmallVectorBase.BeginX + EltDiff));
      }
      sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
      sVar6 = SmallVectorBase::size((SmallVectorBase *)RHS);
      if (sVar6 < sVar5) {
        sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
        sVar6 = SmallVectorBase::size((SmallVectorBase *)RHS);
        pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        pvVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        sVar7 = SmallVectorBase::size((SmallVectorBase *)this);
        pvVar3 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        sVar8 = SmallVectorBase::size((SmallVectorBase *)RHS);
        SmallVectorTemplateBase<char,true>::uninitialized_copy<char,char>
                  ((char *)((long)pvVar1 + i),(char *)((long)pvVar2 + sVar7),
                   (char *)((long)pvVar3 + sVar8),(type *)0x0);
        sVar7 = SmallVectorBase::size((SmallVectorBase *)RHS);
        SmallVectorBase::set_size((SmallVectorBase *)RHS,sVar7 + (sVar5 - sVar6));
        pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        pvVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
        SmallVectorTemplateBase<char,_true>::destroy_range
                  ((char *)((long)pvVar1 + i),(char *)((long)pvVar2 + sVar5));
        SmallVectorBase::set_size((SmallVectorBase *)this,i);
      }
      else {
        sVar5 = SmallVectorBase::size((SmallVectorBase *)RHS);
        sVar6 = SmallVectorBase::size((SmallVectorBase *)this);
        if (sVar6 < sVar5) {
          sVar5 = SmallVectorBase::size((SmallVectorBase *)RHS);
          sVar6 = SmallVectorBase::size((SmallVectorBase *)this);
          pvVar1 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          pvVar2 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          sVar7 = SmallVectorBase::size((SmallVectorBase *)RHS);
          pvVar3 = (this->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          sVar8 = SmallVectorBase::size((SmallVectorBase *)this);
          SmallVectorTemplateBase<char,true>::uninitialized_copy<char,char>
                    ((char *)((long)pvVar1 + i),(char *)((long)pvVar2 + sVar7),
                     (char *)((long)pvVar3 + sVar8),(type *)0x0);
          sVar7 = SmallVectorBase::size((SmallVectorBase *)this);
          SmallVectorBase::set_size((SmallVectorBase *)this,sVar7 + (sVar5 - sVar6));
          pvVar1 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          pvVar2 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          sVar5 = SmallVectorBase::size((SmallVectorBase *)RHS);
          SmallVectorTemplateBase<char,_true>::destroy_range
                    ((char *)((long)pvVar1 + i),(char *)((long)pvVar2 + sVar5));
          SmallVectorBase::set_size((SmallVectorBase *)RHS,i);
        }
      }
    }
    else {
      std::swap<void*>((void **)this,(void **)RHS);
      std::swap<unsigned_int>
                (&(this->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size,
                 &(RHS->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size);
      std::swap<unsigned_int>
                (&(this->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity,
                 &(RHS->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity);
    }
  }
  return;
}

Assistant:

void SmallVectorImpl<T>::swap(SmallVectorImpl<T> &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither vector is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->BeginX, RHS.BeginX);
    std::swap(this->Size, RHS.Size);
    std::swap(this->Capacity, RHS.Capacity);
    return;
  }
  if (RHS.size() > this->capacity())
    this->grow(RHS.size());
  if (this->size() > RHS.capacity())
    RHS.grow(this->size());

  // Swap the shared elements.
  size_t NumShared = this->size();
  if (NumShared > RHS.size()) NumShared = RHS.size();
  for (size_type i = 0; i != NumShared; ++i)
    std::swap((*this)[i], RHS[i]);

  // Copy over the extra elts.
  if (this->size() > RHS.size()) {
    size_t EltDiff = this->size() - RHS.size();
    this->uninitialized_copy(this->begin()+NumShared, this->end(), RHS.end());
    RHS.set_size(RHS.size() + EltDiff);
    this->destroy_range(this->begin()+NumShared, this->end());
    this->set_size(NumShared);
  } else if (RHS.size() > this->size()) {
    size_t EltDiff = RHS.size() - this->size();
    this->uninitialized_copy(RHS.begin()+NumShared, RHS.end(), this->end());
    this->set_size(this->size() + EltDiff);
    this->destroy_range(RHS.begin()+NumShared, RHS.end());
    RHS.set_size(NumShared);
  }
}